

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeDrawList(ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  bool bVar1;
  int iVar2;
  ImDrawCmd *pIVar3;
  ImDrawList *pIVar4;
  ImDrawCmd *pIVar5;
  ImDrawList *in_RDX;
  ImDrawList *in_RSI;
  long in_RDI;
  float fVar6;
  ImDrawListFlags backup_flags;
  ImDrawVert *v;
  int n_1;
  ImVec2 triangle_1 [3];
  char *buf_end;
  char *buf_p;
  int idx_i;
  int prim;
  ImGuiListClipper clipper;
  int n;
  ImVec2 triangle [3];
  uint idx_n;
  float total_area;
  ImDrawVert *vtx_buffer;
  ImDrawIdx *idx_buffer;
  bool pcmd_node_open;
  char buf [300];
  ImDrawCmd *pcmd;
  ImDrawList *fg_draw_list;
  bool node_open;
  int cmd_count;
  ImGuiMetricsConfig *cfg;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffccc;
  ImGuiListClipper *in_stack_fffffffffffffcd0;
  ImGuiListClipper *in_stack_fffffffffffffce0;
  char *local_318;
  uint local_2fc;
  ImVec2 *local_2e0;
  ImGuiListClipper *pIVar7;
  undefined4 in_stack_fffffffffffffd40;
  uint in_stack_fffffffffffffd44;
  undefined8 in_stack_fffffffffffffd50;
  ImVec2 *this;
  undefined8 in_stack_fffffffffffffd58;
  ImVec2 *pIVar8;
  ImVec2 *in_stack_fffffffffffffd60;
  ImVec2 *in_stack_fffffffffffffd68;
  ImDrawList *in_stack_fffffffffffffd70;
  ImDrawCmd *pIVar9;
  ImDrawList *pIVar10;
  ImDrawList *draw_list_00;
  undefined4 in_stack_fffffffffffffda8;
  ImDrawListFlags in_stack_fffffffffffffdac;
  float in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  ImDrawVert *in_stack_fffffffffffffdb8;
  int local_23c;
  ImVec2 local_238 [4];
  ImGuiListClipper *local_218;
  uint local_20c;
  int local_208;
  int local_1f8;
  int local_1f4;
  ImVec2 local_1d4;
  int local_1cc;
  ImVec2 local_1c8 [4];
  uint local_1a8;
  float local_1a4;
  ImDrawVert *local_1a0;
  unsigned_short *local_198;
  byte local_189;
  ImGuiListClipper local_188 [7];
  float in_stack_ffffffffffffff58;
  ImDrawFlags in_stack_ffffffffffffff5c;
  ImU32 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  ImVec2 *in_stack_ffffffffffffff68;
  ImDrawList *in_stack_ffffffffffffff70;
  undefined1 auStack_5c [4];
  ImDrawCmd *local_58;
  ImVec2 local_50;
  ImDrawList *local_48;
  ImVec4 local_40;
  byte local_2d;
  int local_2c;
  ImGuiMetricsConfig *local_28;
  ImGuiContext *local_20;
  ImDrawList *local_18;
  ImDrawList *local_10;
  long local_8;
  
  local_20 = GImGui;
  local_28 = &GImGui->DebugMetricsConfig;
  local_2c = (in_RSI->CmdBuffer).Size;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (((0 < local_2c) &&
      (pIVar3 = ImVector<ImDrawCmd>::back(&in_RSI->CmdBuffer), pIVar3->ElemCount == 0)) &&
     (pIVar3 = ImVector<ImDrawCmd>::back(&local_10->CmdBuffer),
     pIVar3->UserCallback == (ImDrawCallback)0x0)) {
    local_2c = local_2c + -1;
  }
  if (local_10->_OwnerName == (char *)0x0) {
    pIVar3 = (ImDrawCmd *)0x552d6a;
  }
  else {
    pIVar3 = (ImDrawCmd *)local_10->_OwnerName;
  }
  iVar2 = local_2c;
  draw_list_00 = local_10;
  local_2d = TreeNode(local_10,"%s: \'%s\' %d vtx, %d indices, %d cmds",local_18,pIVar3,
                      (ulong)(uint)(local_10->VtxBuffer).Size,
                      (ulong)(uint)(local_10->IdxBuffer).Size);
  pIVar10 = local_10;
  pIVar4 = GetWindowDrawList();
  if (pIVar10 == pIVar4) {
    SameLine(0.0,-1.0);
    ImVec4::ImVec4(&local_40,1.0,0.4,0.4,1.0);
    TextColored(&local_40,"CURRENTLY APPENDING");
    if ((local_2d & 1) != 0) {
      TreePop();
    }
  }
  else {
    local_48 = GetForegroundDrawList((ImGuiWindow *)0x4b51ed);
    pIVar4 = local_18;
    if (((local_8 != 0) &&
        (bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0), pIVar4 = local_18,
        bVar1)) && (local_48 != (ImDrawList *)0x0)) {
      local_50 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffccc,iVar2),(ImVec2 *)0x4b524c)
      ;
      ImDrawList::AddRect(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                          in_stack_fffffffffffffd60,
                          (ImU32)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                          (float)in_stack_fffffffffffffd58,
                          (ImDrawFlags)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                          (float)in_stack_fffffffffffffd50);
      pIVar4 = local_18;
    }
    if ((local_2d & 1) != 0) {
      if ((local_8 != 0) && ((*(byte *)(local_8 + 0x97) & 1) == 0)) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
      for (local_58 = (local_10->CmdBuffer).Data; local_58 < (local_10->CmdBuffer).Data + local_2c;
          local_58 = local_58 + 1) {
        if (local_58->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString((char *)(double)(local_58->ClipRect).x,
                         (size_t)(double)(local_58->ClipRect).y,
                         (char *)(double)(local_58->ClipRect).z,(double)(local_58->ClipRect).w,
                         local_188,300,
                         "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         (ulong)local_58->ElemCount / 3,local_58->TextureId);
          pIVar9 = local_58;
          pIVar5 = ImVector<ImDrawCmd>::begin(&local_10->CmdBuffer);
          local_189 = TreeNode((void *)(((long)pIVar9 - (long)pIVar5) / 0x38),"%s",local_188);
          bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
          if ((bVar1) &&
             ((((local_28->ShowDrawCmdMesh & 1U) != 0 ||
               ((local_28->ShowDrawCmdBoundingBoxes & 1U) != 0)) && (local_48 != (ImDrawList *)0x0))
             )) {
            DebugNodeDrawCmdShowMeshAndBoundingBox
                      (pIVar4,draw_list_00,pIVar3,SUB81((ulong)pIVar10 >> 0x38,0),
                       SUB81((ulong)pIVar10 >> 0x30,0));
          }
          if ((local_189 & 1) != 0) {
            if ((local_10->IdxBuffer).Size < 1) {
              local_198 = (unsigned_short *)0x0;
            }
            else {
              local_198 = (local_10->IdxBuffer).Data;
            }
            local_1a0 = (local_10->VtxBuffer).Data + local_58->VtxOffset;
            local_1a4 = 0.0;
            local_1a8 = local_58->IdxOffset;
            while (local_1a8 < local_58->IdxOffset + local_58->ElemCount) {
              this = local_1c8;
              pIVar8 = local_1c8 + 3;
              do {
                ImVec2::ImVec2(this);
                this = this + 1;
              } while (this != pIVar8);
              for (local_1cc = 0; local_1cc < 3; local_1cc = local_1cc + 1) {
                in_stack_fffffffffffffd44 = local_1a8;
                if (local_198 != (unsigned_short *)0x0) {
                  in_stack_fffffffffffffd44 = (uint)local_198[local_1a8];
                }
                local_1c8[local_1cc] = local_1a0[in_stack_fffffffffffffd44].pos;
                local_1a8 = local_1a8 + 1;
              }
              fVar6 = ImTriangleArea(local_1c8,local_1c8 + 1,local_1c8 + 2);
              local_1a4 = fVar6 + local_1a4;
            }
            ImFormatString((char *)(double)local_1a4,(size_t)local_188,(char *)0x12c,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           (ulong)local_58->ElemCount,(ulong)local_58->VtxOffset,
                           (ulong)local_58->IdxOffset);
            pIVar7 = local_188;
            ImVec2::ImVec2(&local_1d4,0.0,0.0);
            Selectable((char *)in_stack_fffffffffffffdb8,(bool)in_stack_fffffffffffffdb7,
                       (ImGuiSelectableFlags)in_stack_fffffffffffffdb0,
                       (ImVec2 *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
            bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0);
            if ((bVar1) && (local_48 != (ImDrawList *)0x0)) {
              DebugNodeDrawCmdShowMeshAndBoundingBox
                        (pIVar4,draw_list_00,pIVar3,SUB81((ulong)pIVar10 >> 0x38,0),
                         SUB81((ulong)pIVar10 >> 0x30,0));
            }
            ImGuiListClipper::ImGuiListClipper(in_stack_fffffffffffffcd0);
            ImGuiListClipper::Begin
                      ((ImGuiListClipper *)
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       (int)((ulong)pIVar7 >> 0x20),SUB84(pIVar7,0));
            while (bVar1 = ImGuiListClipper::Step(in_stack_fffffffffffffce0), bVar1) {
              local_208 = local_1f8;
              local_20c = local_58->IdxOffset + local_1f8 * 3;
              for (; local_208 < local_1f4; local_208 = local_208 + 1) {
                local_218 = local_188;
                local_238[3] = (ImVec2)auStack_5c;
                local_2e0 = local_238;
                do {
                  ImVec2::ImVec2(local_2e0);
                  local_2e0 = local_2e0 + 1;
                } while (local_2e0 != local_238 + 3);
                for (local_23c = 0; local_23c < 3; local_23c = local_23c + 1) {
                  if (local_198 == (unsigned_short *)0x0) {
                    local_2fc = local_20c;
                  }
                  else {
                    local_2fc = (uint)local_198[(int)local_20c];
                  }
                  in_stack_fffffffffffffdb8 = local_1a0 + (int)local_2fc;
                  local_238[local_23c] = in_stack_fffffffffffffdb8->pos;
                  if (local_23c == 0) {
                    local_318 = "Vert:";
                  }
                  else {
                    local_318 = "     ";
                  }
                  iVar2 = ImFormatString((char *)(double)(in_stack_fffffffffffffdb8->pos).x,
                                         (size_t)(double)(in_stack_fffffffffffffdb8->pos).y,
                                         (char *)(double)(in_stack_fffffffffffffdb8->uv).x,
                                         (double)(in_stack_fffffffffffffdb8->uv).y,local_218,
                                         (long)local_238[3] - (long)local_218,
                                         "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                         local_318,(ulong)local_20c,
                                         (ulong)in_stack_fffffffffffffdb8->col);
                  local_218 = (ImGuiListClipper *)((long)&local_218->DisplayStart + (long)iVar2);
                  local_20c = local_20c + 1;
                }
                in_stack_fffffffffffffce0 = local_188;
                ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdb0,0.0,0.0);
                Selectable((char *)in_stack_fffffffffffffdb8,(bool)in_stack_fffffffffffffdb7,
                           (ImGuiSelectableFlags)in_stack_fffffffffffffdb0,
                           (ImVec2 *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
                if ((local_48 != (ImDrawList *)0x0) &&
                   (bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffce0), bVar1)) {
                  in_stack_fffffffffffffdac = local_48->Flags;
                  local_48->Flags = local_48->Flags & 0xfffffffe;
                  ImDrawList::AddPolyline
                            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                             in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
                  local_48->Flags = in_stack_fffffffffffffdac;
                }
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)0x4b5ad9);
          }
        }
        else {
          BulletText("Callback %p, user_data %p",local_58->UserCallback,local_58->UserCallbackData);
        }
      }
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered() && fg_draw_list)
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}